

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# countryflags.cpp
# Opt level: O3

CCountryFlag * __thiscall CCountryFlags::GetByIndex(CCountryFlags *this,int Index,bool SkipBlocked)

{
  uint uVar1;
  CCountryFlag *pCVar2;
  ulong uVar3;
  bool bVar4;
  
  uVar1 = (this->m_aCountryFlags).
          super_array<CCountryFlags::CCountryFlag,_allocator_default<CCountryFlags::CCountryFlag>_>.
          num_elements;
  uVar3 = (ulong)uVar1;
  if (0 < (int)uVar1 && SkipBlocked) {
    pCVar2 = (this->m_aCountryFlags).
             super_array<CCountryFlags::CCountryFlag,_allocator_default<CCountryFlags::CCountryFlag>_>
             .list;
    do {
      if ((pCVar2->m_Blocked == false) && (bVar4 = Index == 0, Index = Index + -1, bVar4)) {
        return pCVar2;
      }
      pCVar2 = pCVar2 + 1;
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  uVar3 = 0;
  if (0 < Index % (int)uVar1) {
    uVar3 = (ulong)(uint)(Index % (int)uVar1);
  }
  return (this->m_aCountryFlags).
         super_array<CCountryFlags::CCountryFlag,_allocator_default<CCountryFlags::CCountryFlag>_>.
         list + uVar3;
}

Assistant:

const CCountryFlags::CCountryFlag *CCountryFlags::GetByIndex(int Index, bool SkipBlocked) const
{
	if(SkipBlocked)
	{
		for(int i = 0; i < m_aCountryFlags.size(); i++)
			if(!m_aCountryFlags[i].m_Blocked)
				if(!Index--)
					return &m_aCountryFlags[i];
	}
	return &m_aCountryFlags[maximum(0, Index%m_aCountryFlags.size())];
}